

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SessionTestCase.cpp
# Opt level: O2

void __thiscall
SuiteSessionTests::
initiatorFixtureInvalidRawFixTMessage_LogonMessageHeaderOrderInvalid_InvalidMessageExceptionHelper::
RunImpl(initiatorFixtureInvalidRawFixTMessage_LogonMessageHeaderOrderInvalid_InvalidMessageExceptionHelper
        *this)

{
  string *psVar1;
  TestResults *this_00;
  sessionFixture *psVar2;
  DataDictionary *pDVar3;
  Session *pSVar4;
  TestResults **ppTVar5;
  TestDetails **ppTVar6;
  string newOrderSingleRawFIX;
  string delimSOH;
  TestDetails local_de0;
  shared_ptr<FIX::DataDictionary> pDataDictionary;
  __shared_ptr<FIX::DataDictionary,_(__gnu_cxx::_Lock_policy)2> local_db0;
  __shared_ptr<FIX::DataDictionary,_(__gnu_cxx::_Lock_policy)2> local_da0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d50;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d30;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d10;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_cf0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_cd0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_cb0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c50;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c30;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c10;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_bf0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_bd0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_bb0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b70;
  TimeRange sessionTime;
  NewOrderSingle newOrderSingle;
  SessionID sessionID;
  DataDictionaryProvider provider;
  DataDictionary dictionary;
  string local_3f8 [30];
  
  FIX::UtcTimeStamp::UtcTimeStamp((UtcTimeStamp *)&provider,8,8,8,0xd,5,0x7df);
  psVar2 = &(this->super_initiatorFixture).super_sessionFixture;
  (psVar2->super_TestCallback).startTimeStamp.super_DateTime.m_date =
       provider.m_transportDictionaries._M_t._M_impl.super__Rb_tree_header._M_header._M_color;
  *(undefined4 *)&(psVar2->super_TestCallback).startTimeStamp.super_DateTime.field_0xc =
       provider.m_transportDictionaries._M_t._M_impl.super__Rb_tree_header._M_header._4_4_;
  (this->super_initiatorFixture).super_sessionFixture.super_TestCallback.startTimeStamp.
  super_DateTime.m_time =
       (int64_t)provider.m_transportDictionaries._M_t._M_impl.super__Rb_tree_header._M_header.
                _M_parent;
  FIX::UtcTimeStamp::UtcTimeStamp((UtcTimeStamp *)&provider,0x10,0x10,0x10,0xd,5,0x898);
  psVar2 = &(this->super_initiatorFixture).super_sessionFixture;
  (psVar2->super_TestCallback).endTimeStamp.super_DateTime.m_date =
       provider.m_transportDictionaries._M_t._M_impl.super__Rb_tree_header._M_header._M_color;
  *(undefined4 *)&(psVar2->super_TestCallback).endTimeStamp.super_DateTime.field_0xc =
       provider.m_transportDictionaries._M_t._M_impl.super__Rb_tree_header._M_header._4_4_;
  (this->super_initiatorFixture).super_sessionFixture.super_TestCallback.endTimeStamp.super_DateTime
  .m_time = (int64_t)provider.m_transportDictionaries._M_t._M_impl.super__Rb_tree_header._M_header.
                     _M_parent;
  (this->super_initiatorFixture).super_sessionFixture.super_TestCallback.startTime.super_DateTime.
  m_date = 0;
  *(undefined8 *)
   &(this->super_initiatorFixture).super_sessionFixture.super_TestCallback.startTime.super_DateTime.
    field_0xc = *(undefined8 *)
                 &(this->super_initiatorFixture).super_sessionFixture.super_TestCallback.
                  startTimeStamp.super_DateTime.field_0xc;
  *(undefined4 *)
   ((long)&(this->super_initiatorFixture).super_sessionFixture.super_TestCallback.startTime.
           super_DateTime.m_time + 4) =
       *(undefined4 *)
        ((long)&(this->super_initiatorFixture).super_sessionFixture.super_TestCallback.
                startTimeStamp.super_DateTime.m_time + 4);
  (this->super_initiatorFixture).super_sessionFixture.super_TestCallback.endTime.super_DateTime.
  m_date = 0;
  *(undefined8 *)
   &(this->super_initiatorFixture).super_sessionFixture.super_TestCallback.endTime.super_DateTime.
    field_0xc = *(undefined8 *)
                 &(this->super_initiatorFixture).super_sessionFixture.super_TestCallback.
                  endTimeStamp.super_DateTime.field_0xc;
  *(undefined4 *)
   ((long)&(this->super_initiatorFixture).super_sessionFixture.super_TestCallback.endTime.
           super_DateTime.m_time + 4) =
       *(undefined4 *)
        ((long)&(this->super_initiatorFixture).super_sessionFixture.super_TestCallback.endTimeStamp.
                super_DateTime.m_time + 4);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&sessionTime,"FIXT.1.1",(allocator<char> *)&local_d30);
  FIX::BeginString::BeginString((BeginString *)&provider,(STRING *)&sessionTime);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&newOrderSingleRawFIX,"TW",(allocator<char> *)&local_d50);
  FIX::SenderCompID::SenderCompID((SenderCompID *)&dictionary,&newOrderSingleRawFIX);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&delimSOH,"ISLD",(allocator<char> *)&local_d70);
  FIX::TargetCompID::TargetCompID((TargetCompID *)&newOrderSingle,&delimSOH);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_de0,"",(allocator<char> *)&local_d90);
  FIX::SessionID::SessionID
            (&sessionID,
             (string *)
             &provider.m_transportDictionaries._M_t._M_impl.super__Rb_tree_header._M_header.
              _M_parent,local_3f8,(string *)&newOrderSingle.super_Message.field_0x10,
             (string *)&local_de0);
  std::__cxx11::string::~string((string *)&local_de0);
  FIX::FieldBase::~FieldBase((FieldBase *)&newOrderSingle);
  std::__cxx11::string::~string((string *)&delimSOH);
  FIX::FieldBase::~FieldBase((FieldBase *)&dictionary);
  std::__cxx11::string::~string((string *)&newOrderSingleRawFIX);
  FIX::FieldBase::~FieldBase((FieldBase *)&provider);
  std::__cxx11::string::~string((string *)&sessionTime);
  FIX::TimeRange::TimeRange
            (&sessionTime,
             &(this->super_initiatorFixture).super_sessionFixture.super_TestCallback.startTime,
             &(this->super_initiatorFixture).super_sessionFixture.super_TestCallback.endTime,0,0x1f)
  ;
  FIX::DataDictionaryProvider::DataDictionaryProvider(&provider);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&dictionary,"../spec/FIXT11.xml",(allocator<char> *)&newOrderSingle);
  FIX::DataDictionaryProvider::addTransportDataDictionary
            (&provider,&sessionID.m_beginString,(string *)&dictionary);
  std::__cxx11::string::~string((string *)&dictionary);
  pDVar3 = (DataDictionary *)
           FIX::DataDictionaryProvider::getSessionDataDictionary((BeginString *)&provider);
  FIX::DataDictionary::DataDictionary(&dictionary,pDVar3);
  std::make_shared<FIX::DataDictionary,FIX::DataDictionary&>((DataDictionary *)&pDataDictionary);
  std::__shared_ptr<FIX::DataDictionary,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_da0,
             &pDataDictionary.super___shared_ptr<FIX::DataDictionary,_(__gnu_cxx::_Lock_policy)2>);
  FIX::DataDictionaryProvider::addTransportDataDictionary(&provider,&sessionID,&local_da0);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_da0._M_refcount);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&newOrderSingleRawFIX,"20",(allocator<char> *)&delimSOH);
  FIX::ApplVerID::ApplVerID((ApplVerID *)&newOrderSingle,&newOrderSingleRawFIX);
  std::__shared_ptr<FIX::DataDictionary,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_db0,
             &pDataDictionary.super___shared_ptr<FIX::DataDictionary,_(__gnu_cxx::_Lock_policy)2>);
  FIX::DataDictionaryProvider::addApplicationDataDictionary(&provider,&newOrderSingle,&local_db0);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_db0._M_refcount);
  FIX::FieldBase::~FieldBase((FieldBase *)&newOrderSingle);
  std::__cxx11::string::~string((string *)&newOrderSingleRawFIX);
  pSVar4 = (Session *)operator_new(0x848);
  FIX::Session::Session
            (pSVar4,&(this->super_initiatorFixture).super_sessionFixture.super_TestCallback.
                     super_NullApplication.super_Application,
             (MessageStoreFactory *)&(this->super_initiatorFixture).super_sessionFixture.factory,
             &sessionID,&provider,&sessionTime,1,(LogFactory *)0x0);
  (this->super_initiatorFixture).super_sessionFixture.object = pSVar4;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&newOrderSingleRawFIX,"20",(allocator<char> *)&delimSOH);
  FIX::ApplVerID::ApplVerID((ApplVerID *)&newOrderSingle,&newOrderSingleRawFIX);
  std::__cxx11::string::_M_assign((string *)(pSVar4 + 0x1f8));
  FIX::FieldBase::~FieldBase((FieldBase *)&newOrderSingle);
  std::__cxx11::string::~string((string *)&newOrderSingleRawFIX);
  pSVar4 = (this->super_initiatorFixture).super_sessionFixture.object;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&newOrderSingleRawFIX,"20",(allocator<char> *)&delimSOH);
  FIX::ApplVerID::ApplVerID((ApplVerID *)&newOrderSingle,&newOrderSingleRawFIX);
  std::__cxx11::string::_M_assign((string *)(pSVar4 + 0x218));
  FIX::FieldBase::~FieldBase((FieldBase *)&newOrderSingle);
  std::__cxx11::string::~string((string *)&newOrderSingleRawFIX);
  FIX42::NewOrderSingle::NewOrderSingle(&newOrderSingle);
  newOrderSingleRawFIX._M_dataplus._M_p = (pointer)&newOrderSingleRawFIX.field_2;
  newOrderSingleRawFIX._M_string_length = 0;
  newOrderSingleRawFIX.field_2._M_local_buf[0] = '\0';
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&delimSOH,"\x01",(allocator<char> *)&local_de0);
  std::operator+(&local_d10,"8=FIXT.4.2",&delimSOH);
  std::operator+(&local_cf0,&local_d10,"35=A");
  std::operator+(&local_cd0,&local_cf0,&delimSOH);
  std::operator+(&local_cb0,&local_cd0,"9=114");
  std::operator+(&local_c90,&local_cb0,&delimSOH);
  std::operator+(&local_c70,&local_c90,"34=2");
  std::operator+(&local_c50,&local_c70,&delimSOH);
  std::operator+(&local_c30,&local_c50,"49=ISLD");
  std::operator+(&local_c10,&local_c30,&delimSOH);
  std::operator+(&local_bf0,&local_c10,"56=TW");
  std::operator+(&local_bd0,&local_bf0,&delimSOH);
  std::operator+(&local_bb0,&local_bd0,"52=20190517-16:08:43");
  std::operator+(&local_b90,&local_bb0,&delimSOH);
  std::operator+(&local_b70,&local_b90,"98=0");
  std::operator+(&local_d90,&local_b70,&delimSOH);
  std::operator+(&local_d70,&local_d90,"108=1");
  std::operator+(&local_d50,&local_d70,&delimSOH);
  std::operator+(&local_d30,&local_d50,"10=166");
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_de0,
                 &local_d30,&delimSOH);
  std::__cxx11::string::operator=((string *)&newOrderSingleRawFIX,(string *)&local_de0);
  std::__cxx11::string::~string((string *)&local_de0);
  std::__cxx11::string::~string((string *)&local_d30);
  std::__cxx11::string::~string((string *)&local_d50);
  std::__cxx11::string::~string((string *)&local_d70);
  std::__cxx11::string::~string((string *)&local_d90);
  std::__cxx11::string::~string((string *)&local_b70);
  std::__cxx11::string::~string((string *)&local_b90);
  std::__cxx11::string::~string((string *)&local_bb0);
  std::__cxx11::string::~string((string *)&local_bd0);
  std::__cxx11::string::~string((string *)&local_bf0);
  std::__cxx11::string::~string((string *)&local_c10);
  std::__cxx11::string::~string((string *)&local_c30);
  std::__cxx11::string::~string((string *)&local_c50);
  std::__cxx11::string::~string((string *)&local_c70);
  std::__cxx11::string::~string((string *)&local_c90);
  std::__cxx11::string::~string((string *)&local_cb0);
  std::__cxx11::string::~string((string *)&local_cd0);
  std::__cxx11::string::~string((string *)&local_cf0);
  std::__cxx11::string::~string((string *)&local_d10);
  psVar1 = (string *)(this->super_initiatorFixture).super_sessionFixture.object;
  FIX::UtcTimeStamp::UtcTimeStamp((UtcTimeStamp *)&local_de0);
  FIX::Session::next(psVar1,(UtcTimeStamp *)&newOrderSingleRawFIX,SUB81(&local_de0,0));
  ppTVar5 = UnitTest::CurrentTest::Results();
  this_00 = *ppTVar5;
  ppTVar6 = UnitTest::CurrentTest::Details();
  UnitTest::TestDetails::TestDetails(&local_de0,*ppTVar6,0xa4e);
  UnitTest::TestResults::OnTestFailure
            (this_00,&local_de0,"Expected exception: \"InvalidMessage\" not thrown");
  std::__cxx11::string::~string((string *)&delimSOH);
  std::__cxx11::string::~string((string *)&newOrderSingleRawFIX);
  FIX::Message::~Message((Message *)&newOrderSingle);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&pDataDictionary.super___shared_ptr<FIX::DataDictionary,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  FIX::DataDictionary::~DataDictionary(&dictionary);
  FIX::DataDictionaryProvider::~DataDictionaryProvider(&provider);
  FIX::SessionID::~SessionID(&sessionID);
  return;
}

Assistant:

TEST_FIXTURE(initiatorFixture, InvalidRawFixTMessage_LogonMessageHeaderOrderInvalid_InvalidMessageException) {

  startTimeStamp = UtcTimeStamp(8, 8, 8, 13, 5, 2015);
  endTimeStamp = UtcTimeStamp(16, 16, 16, 13, 5, 2200);
  startTime = UtcTimeOnly( startTimeStamp );
  endTime = UtcTimeOnly( endTimeStamp );

  SessionID sessionID( BeginString( "FIXT.1.1" ), SenderCompID( "TW" ), TargetCompID( "ISLD" ) );

  TimeRange sessionTime( startTime, endTime, 0, 31);

  DataDictionaryProvider provider;
  provider.addTransportDataDictionary( sessionID.getBeginString(), "../spec/FIXT11.xml" );
  DataDictionary dictionary = provider.getSessionDataDictionary(sessionID.getBeginString());

  std::shared_ptr<DataDictionary> pDataDictionary = std::make_shared<DataDictionary>(dictionary);

  provider.addTransportDataDictionary( sessionID.getBeginString(), pDataDictionary );
  provider.addApplicationDataDictionary(ApplVerID("20"), pDataDictionary);

  object = new Session( *this, factory, sessionID, provider,
      sessionTime, 1, 0 );
  object->setSenderDefaultApplVerID(ApplVerID("20"));
  object->setTargetDefaultApplVerID(ApplVerID("20"));


  FIX42::NewOrderSingle newOrderSingle;
  std::string newOrderSingleRawFIX;
  std::string delimSOH = "\x01";
  newOrderSingleRawFIX = "8=FIXT.4.2" + delimSOH
      + "35=A" + delimSOH
      + "9=114" + delimSOH
      + "34=2" + delimSOH
      + "49=ISLD" + delimSOH
      + "56=TW" + delimSOH
      + "52=20190517-16:08:43" + delimSOH
      + "98=0" + delimSOH
      + "108=1" + delimSOH
      + "10=166" + delimSOH;

  CHECK_THROW(object->next(newOrderSingleRawFIX, UtcTimeStamp()), InvalidMessage);
}